

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextCharFromUtf8(uint *out_char,char *in_text,char *in_text_end)

{
  byte bVar1;
  int iVar2;
  uint local_40;
  uint local_3c;
  uint local_38;
  int e;
  uchar s [4];
  int wanted;
  int len;
  char *in_text_end_local;
  char *in_text_local;
  uint *out_char_local;
  
  iVar2 = (int)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
               [(int)(uint)(byte)*in_text >> 3];
  e = iVar2 + (uint)((iVar2 != 0 ^ 0xffU) & 1);
  _wanted = in_text_end;
  if (in_text_end == (char *)0x0) {
    _wanted = in_text + e;
  }
  if (in_text < _wanted) {
    bVar1 = *in_text;
  }
  else {
    bVar1 = 0;
  }
  if (in_text + 1 < _wanted) {
    local_38 = (uint)in_text[1];
  }
  else {
    local_38 = 0;
  }
  if (in_text + 2 < _wanted) {
    local_3c = (uint)in_text[2];
  }
  else {
    local_3c = 0;
  }
  if (in_text + 3 < _wanted) {
    local_40 = (uint)in_text[3];
  }
  else {
    local_40 = 0;
  }
  *out_char = ((uint)bVar1 & ImTextCharFromUtf8::masks[iVar2]) << 0x12;
  *out_char = (local_38 & 0x3f) << 0xc | *out_char;
  *out_char = (local_3c & 0x3f) << 6 | *out_char;
  *out_char = local_40 & 0x3f | *out_char;
  *out_char = *out_char >> ((byte)ImTextCharFromUtf8::shiftc[iVar2] & 0x1f);
  if ((int)(((int)(local_40 & 0xff) >> 6 |
            (int)(local_3c & 0xc0) >> 4 |
            (int)(local_38 & 0xc0) >> 2 |
            (uint)(0x10ffff < *out_char) << 8 |
            (uint)(*out_char >> 0xb == 0x1b) << 7 |
            (uint)(*out_char < ImTextCharFromUtf8::mins[iVar2]) << 6) ^ 0x2a) >>
      ((byte)ImTextCharFromUtf8::shifte[iVar2] & 0x1f) != 0) {
    e = ImMin<int>(e,(uint)(bVar1 != 0) + (uint)((char)local_38 != '\0') +
                     (uint)((char)local_3c != '\0') + (uint)((char)local_40 != '\0'));
    *out_char = 0xfffd;
  }
  return e;
}

Assistant:

int ImTextCharFromUtf8(unsigned int* out_char, const char* in_text, const char* in_text_end)
{
    static const char lengths[32] = { 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 2, 2, 2, 2, 3, 3, 4, 0 };
    static const int masks[]  = { 0x00, 0x7f, 0x1f, 0x0f, 0x07 };
    static const uint32_t mins[] = { 0x400000, 0, 0x80, 0x800, 0x10000 };
    static const int shiftc[] = { 0, 18, 12, 6, 0 };
    static const int shifte[] = { 0, 6, 4, 2, 0 };
    int len = lengths[*(const unsigned char*)in_text >> 3];
    int wanted = len + !len;

    if (in_text_end == NULL)
        in_text_end = in_text + wanted; // Max length, nulls will be taken into account.

    // Copy at most 'len' bytes, stop copying at 0 or past in_text_end. Branch predictor does a good job here,
    // so it is fast even with excessive branching.
    unsigned char s[4];
    s[0] = in_text + 0 < in_text_end ? in_text[0] : 0;
    s[1] = in_text + 1 < in_text_end ? in_text[1] : 0;
    s[2] = in_text + 2 < in_text_end ? in_text[2] : 0;
    s[3] = in_text + 3 < in_text_end ? in_text[3] : 0;

    // Assume a four-byte character and load four bytes. Unused bits are shifted out.
    *out_char  = (uint32_t)(s[0] & masks[len]) << 18;
    *out_char |= (uint32_t)(s[1] & 0x3f) << 12;
    *out_char |= (uint32_t)(s[2] & 0x3f) <<  6;
    *out_char |= (uint32_t)(s[3] & 0x3f) <<  0;
    *out_char >>= shiftc[len];

    // Accumulate the various error conditions.
    int e = 0;
    e  = (*out_char < mins[len]) << 6; // non-canonical encoding
    e |= ((*out_char >> 11) == 0x1b) << 7;  // surrogate half?
    e |= (*out_char > IM_UNICODE_CODEPOINT_MAX) << 8;  // out of range?
    e |= (s[1] & 0xc0) >> 2;
    e |= (s[2] & 0xc0) >> 4;
    e |= (s[3]       ) >> 6;
    e ^= 0x2a; // top two bits of each tail byte correct?
    e >>= shifte[len];

    if (e)
    {
        // No bytes are consumed when *in_text == 0 || in_text == in_text_end.
        // One byte is consumed in case of invalid first byte of in_text.
        // All available bytes (at most `len` bytes) are consumed on incomplete/invalid second to last bytes.
        // Invalid or incomplete input may consume less bytes than wanted, therefore every byte has to be inspected in s.
        wanted = ImMin(wanted, !!s[0] + !!s[1] + !!s[2] + !!s[3]);
        *out_char = IM_UNICODE_CODEPOINT_INVALID;
    }

    return wanted;
}